

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O3

void vk::flushMappedMemoryRange
               (DeviceInterface *vkd,VkDevice device,VkDeviceMemory memory,VkDeviceSize offset,
               VkDeviceSize size)

{
  VkResult result;
  VkMappedMemoryRange range;
  undefined4 local_28 [2];
  undefined8 local_20;
  deUint64 local_18;
  VkDeviceSize local_10;
  VkDeviceSize local_8;
  
  local_28[0] = 6;
  local_20 = 0;
  local_18 = memory.m_internal;
  local_10 = offset;
  local_8 = size;
  result = (*vkd->_vptr_DeviceInterface[9])(vkd,device,1,local_28);
  checkResult(result,"vkd.flushMappedMemoryRanges(device, 1u, &range)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
              ,0xe0);
  return;
}

Assistant:

void flushMappedMemoryRange (const DeviceInterface& vkd, VkDevice device, VkDeviceMemory memory, VkDeviceSize offset, VkDeviceSize size)
{
	const VkMappedMemoryRange	range	=
	{
		VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
		DE_NULL,
		memory,
		offset,
		size
	};

	VK_CHECK(vkd.flushMappedMemoryRanges(device, 1u, &range));
}